

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temporal_filter.c
# Opt level: O2

_Bool av1_tf_info_alloc(TEMPORAL_FILTER_INFO *tf_info,AV1_COMP *cpi)

{
  SequenceHeader *pSVar1;
  int iVar2;
  long lVar3;
  _Bool _Var4;
  
  if ((cpi->oxcf).algo_cfg.arnr_max_frames < 1) {
    tf_info->is_temporal_filter_on = 0;
    _Var4 = true;
  }
  else {
    iVar2 = (cpi->oxcf).gf_cfg.lag_in_frames;
    tf_info->is_temporal_filter_on = (uint)(1 < iVar2);
    _Var4 = true;
    if (1 < iVar2) {
      pSVar1 = (cpi->common).seq_params;
      lVar3 = 8;
      do {
        _Var4 = lVar3 + 0xd0 == 0x278;
        if (_Var4) {
          return _Var4;
        }
        iVar2 = aom_realloc_frame_buffer
                          ((YV12_BUFFER_CONFIG *)
                           ((long)tf_info->tf_buf[0].store_buf_adr + lVar3 + -0x50),
                           (cpi->oxcf).frm_dim_cfg.width,(cpi->oxcf).frm_dim_cfg.height,
                           pSVar1->subsampling_x,pSVar1->subsampling_y,
                           (uint)pSVar1->use_highbitdepth,(cpi->oxcf).border_in_pixels,
                           (cpi->common).features.byte_alignment,(aom_codec_frame_buffer_t *)0x0,
                           (aom_get_frame_buffer_cb_fn_t)0x0,(void *)0x0,cpi->alloc_pyramid,0);
        lVar3 = lVar3 + 0xd0;
      } while (iVar2 == 0);
    }
  }
  return _Var4;
}

Assistant:

bool av1_tf_info_alloc(TEMPORAL_FILTER_INFO *tf_info, const AV1_COMP *cpi) {
  const AV1EncoderConfig *oxcf = &cpi->oxcf;
  tf_info->is_temporal_filter_on = av1_is_temporal_filter_on(oxcf);
  if (tf_info->is_temporal_filter_on == 0) return true;

  const AV1_COMMON *cm = &cpi->common;
  const SequenceHeader *const seq_params = cm->seq_params;
  for (int i = 0; i < TF_INFO_BUF_COUNT; ++i) {
    if (aom_realloc_frame_buffer(
            &tf_info->tf_buf[i], oxcf->frm_dim_cfg.width,
            oxcf->frm_dim_cfg.height, seq_params->subsampling_x,
            seq_params->subsampling_y, seq_params->use_highbitdepth,
            cpi->oxcf.border_in_pixels, cm->features.byte_alignment, NULL, NULL,
            NULL, cpi->alloc_pyramid, 0)) {
      return false;
    }
  }
  return true;
}